

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O3

parse_node * __thiscall
ORPG::ExpressionTree::new_number(ExpressionTree *this,parse_node *curr,int *numBytesToRead)

{
  int iVar1;
  _Alloc_hider __nptr;
  parse_node *ppVar2;
  int *piVar3;
  long lVar4;
  parse_node *ppVar5;
  undefined8 uVar6;
  int numBytesRead;
  string currParseString;
  int local_5c;
  string local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  local_5c = 0;
  parse_input_string(this,&local_58,&local_5c,*numBytesToRead);
  if (curr->left == (parse_node *)0x0) {
    ppVar2 = (parse_node *)operator_new(0x20);
    ppVar2->value = 0;
    ppVar2->left = (parse_node *)0x0;
    ppVar2->right = (parse_node *)0x0;
    *(undefined8 *)((long)&ppVar2->right + 2) = 0;
    *(undefined8 *)((long)&ppVar2->parent + 2) = 0;
    curr->left = ppVar2;
  }
  else {
    ppVar2 = curr;
    if (curr->right != (parse_node *)0x0) goto LAB_001025bc;
    ppVar2 = (parse_node *)operator_new(0x20);
    ppVar2->value = 0;
    ppVar2->left = (parse_node *)0x0;
    ppVar2->right = (parse_node *)0x0;
    *(undefined8 *)((long)&ppVar2->right + 2) = 0;
    *(undefined8 *)((long)&ppVar2->parent + 2) = 0;
    curr->right = ppVar2;
  }
  ppVar2->parent = curr;
LAB_001025bc:
  __nptr._M_p = local_58._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr._M_p,&local_38,10);
  if (local_38 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    ppVar2->value = (int)lVar4;
    ppVar2->op = 1;
    ppVar5 = ppVar2->parent;
    if (ppVar5 == (parse_node *)0x0) {
      if ((this->inputString)._M_string_length == (long)local_5c) {
        ppVar5 = (parse_node *)0x0;
      }
      else {
        ppVar5 = (parse_node *)operator_new(0x20);
        ppVar5->value = 0;
        ppVar5->right = (parse_node *)0x0;
        ppVar5->parent = (parse_node *)0x0;
        ppVar5->op = 0;
        ppVar2->parent = ppVar5;
        ppVar5->left = ppVar2;
      }
    }
    *numBytesToRead = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    return ppVar5;
  }
  uVar6 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

struct parse_node* ExpressionTree::new_number(struct parse_node* curr, int
                            * numBytesToRead) {
        string currParseString = "";
        int numBytesRead = 0;

        parse_input_string(&currParseString, &numBytesRead, *numBytesToRead);

        if(!curr->left) {
            curr->left = allocate_node();
            curr->left->parent = curr;
            curr = curr->left;
        } else if(!curr->right) {
            curr->right = allocate_node();
            curr->right->parent = curr;
            curr = curr->right;
        }
                
        curr->value = stoi(currParseString);
        curr->op = OP_NUMBER;


        if(curr->parent == NULL && (size_t)numBytesRead != inputString.length()) {
            curr->parent = allocate_node();
            curr->parent->left = curr;
        }
            
        curr = curr->parent;

        *numBytesToRead = 0;
        
        return curr;
    }